

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.h
# Opt level: O0

void __thiscall
proto2_unittest::TestAllTypes::unsafe_arena_set_allocated_optional_nested_message
          (TestAllTypes *this,TestAllTypes_NestedMessage *value)

{
  TestAllTypes_NestedMessage *pTVar1;
  Arena *pAVar2;
  uint32_t *puVar3;
  TestAllTypes_NestedMessage *value_local;
  TestAllTypes *this_local;
  
  pAVar2 = google::protobuf::MessageLite::GetArena((MessageLite *)this);
  if ((pAVar2 == (Arena *)0x0) &&
     (pTVar1 = (this->field_0)._impl_.optional_nested_message_,
     pTVar1 != (TestAllTypes_NestedMessage *)0x0)) {
    (*(pTVar1->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  (this->field_0)._impl_.optional_nested_message_ = value;
  if (value == (TestAllTypes_NestedMessage *)0x0) {
    puVar3 = google::protobuf::internal::HasBits<2>::operator[]
                       (&(this->field_0)._impl_._has_bits_,0);
    *puVar3 = *puVar3 & 0xffffffdf;
  }
  else {
    puVar3 = google::protobuf::internal::HasBits<2>::operator[]
                       (&(this->field_0)._impl_._has_bits_,0);
    *puVar3 = *puVar3 | 0x20;
  }
  return;
}

Assistant:

TestAllTypes::unsafe_arena_set_allocated_optional_nested_message(
    ::proto2_unittest::TestAllTypes_NestedMessage* PROTOBUF_NULLABLE value) {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (GetArena() == nullptr) {
    delete reinterpret_cast<::google::protobuf::MessageLite*>(_impl_.optional_nested_message_);
  }
  _impl_.optional_nested_message_ = reinterpret_cast<::proto2_unittest::TestAllTypes_NestedMessage*>(value);
  if (value != nullptr) {
    _impl_._has_bits_[0] |= 0x00000020u;
  } else {
    _impl_._has_bits_[0] &= ~0x00000020u;
  }
  // @@protoc_insertion_point(field_unsafe_arena_set_allocated:proto2_unittest.TestAllTypes.optional_nested_message)
}